

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int duckdb_fmt::v6::internal::
    get_dynamic_spec<duckdb_fmt::v6::internal::width_checker,duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>>,wchar_t>>,duckdb_fmt::v6::internal::error_handler>
              (void)

{
  unsigned_long_long uVar1;
  string *this;
  error_handler local_31;
  width_checker<duckdb_fmt::v6::internal::error_handler> local_30;
  string local_28;
  
  local_30.handler_ = &local_31;
  uVar1 = visit_format_arg<duckdb_fmt::v6::internal::width_checker<duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>>,wchar_t>>
                    (&local_30,
                     (basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                      *)&stack0x00000008);
  if ((uVar1 & 0xffffffff80000000) == 0) {
    return (int)uVar1;
  }
  this = &local_28;
  std::__cxx11::string::string((string *)&local_28,"number is too big",(allocator *)&local_30);
  error_handler::on_error((error_handler *)this,&local_28);
}

Assistant:

FMT_CONSTEXPR int get_dynamic_spec(FormatArg arg, ErrorHandler eh) {
  unsigned long long value = visit_format_arg(Handler<ErrorHandler>(eh), arg);
  if (value > to_unsigned(max_value<int>())) eh.on_error("number is too big");
  return static_cast<int>(value);
}